

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  bool bVar2;
  cmInstallType cVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  string *psVar7;
  cmInstallType type;
  Names *this_02;
  char *__assertion;
  uint uVar8;
  TweakMethod in_R9;
  string to1;
  string from1;
  string targetNameImportLib;
  string toSOName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesTo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesFrom;
  string fromDirConfig;
  string toDir;
  string fromRealName;
  string literal_args;
  Names targetNames;
  string toRealName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TweakMethod tweak;
  
  cVar3 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar3) {
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    type = cVar3;
    break;
  case cmInstallType_FILES:
    GenerateScriptForConfigObjectLibrary(this,os,config,indent);
    return;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetNames,
               "cmInstallTargetGenerator created with non-installable target.",
               (allocator<char> *)&fromDirConfig);
    cmLocalGenerator::IssueMessage(pcVar4,INTERNAL_ERROR,&targetNames.Base);
    this_02 = &targetNames;
    goto LAB_0030fe3d;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assertion = "false && \"INTERFACE_LIBRARY targets have no installable outputs.\"";
    uVar8 = 0x42;
    goto LAB_0030fec2;
  default:
    type = cmInstallType_EXECUTABLE;
  }
  fromDirConfig._M_dataplus._M_p = (pointer)&fromDirConfig.field_2;
  fromDirConfig._M_string_length = 0;
  fromDirConfig.field_2._M_local_buf[0] = '\0';
  bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar1) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    std::__cxx11::string::_M_assign((string *)&fromDirConfig);
    std::__cxx11::string::append((char *)&fromDirConfig);
    std::__cxx11::string::append((char *)&fromDirConfig);
  }
  else {
    cmGeneratorTarget::GetDirectory(&targetNames.Base,this->Target,config,(uint)this->ImportLibrary)
    ;
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)&targetNames);
    std::__cxx11::string::~string((string *)&targetNames);
    std::__cxx11::string::append((char *)&fromDirConfig);
  }
  GetDestination(&targetNames.Base,this,config);
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&toDir,&this->super_cmInstallGenerator,&targetNames.Base);
  std::__cxx11::string::~string((string *)&targetNames);
  std::__cxx11::string::append((char *)&toDir);
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filesFrom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filesTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  literal_args.field_2._M_local_buf[0] = '\0';
  if (cVar3 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assertion = "this->NamelinkMode == NamelinkModeNone";
      uVar8 = 0x6c;
LAB_0030fec2:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,uVar8,
                    "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    cmGeneratorTarget::GetExecutableNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      psVar5 = &targetNames.ImportLibrary;
      std::operator+(&from1,&fromDirConfig,psVar5);
      std::operator+(&to1,&toDir,psVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                 &from1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,&to1)
      ;
      targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
      targetNameImportLib._M_string_length = 0;
      targetNameImportLib.field_2._M_local_buf[0] = '\0';
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,psVar5,&targetNameImportLib,(char *)0x0);
      if (bVar1) {
        std::operator+(&toSOName,&fromDirConfig,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::operator+(&toSOName,&toDir,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
      }
      std::__cxx11::string::~string((string *)&targetNameImportLib);
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&from1);
      type = cmInstallType_STATIC_LIBRARY;
    }
    else {
      psVar5 = &targetNames.Output;
      std::operator+(&from1,&fromDirConfig,psVar5);
      std::operator+(&to1,&toDir,psVar5);
      bVar1 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar1) {
        this_00 = this->Target;
        this_01 = this_00->Target->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetNameImportLib,"BUNDLE_EXTENSION",(allocator<char> *)&toSOName);
        cmGeneratorTarget::GetProperty(this_00,&targetNameImportLib);
        std::__cxx11::string::~string((string *)&targetNameImportLib);
        std::__cxx11::string::append((char *)&literal_args);
        std::__cxx11::string::append((char *)&from1);
        std::__cxx11::string::append((char *)&from1);
        std::__cxx11::string::append((char *)&to1);
        std::__cxx11::string::append((char *)&to1);
        std::__cxx11::string::append((char *)&to1);
        bVar1 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar1) {
          std::__cxx11::string::append((char *)&to1);
        }
        std::__cxx11::string::append((string *)&to1);
        type = cmInstallType_DIRECTORY;
      }
      else {
        bVar1 = std::operator!=(&targetNames.Real,psVar5);
        if (bVar1) {
          std::operator+(&targetNameImportLib,&fromDirConfig,&targetNames.Real);
          psVar7 = (string *)std::__cxx11::string::append((string *)&toDir);
          std::__cxx11::string::string((string *)&toSOName,psVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom
                     ,&targetNameImportLib);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                     &toSOName);
          std::__cxx11::string::~string((string *)&toSOName);
          std::__cxx11::string::~string((string *)&targetNameImportLib);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                 &from1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,&to1)
      ;
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&from1);
    }
    cmGeneratorTarget::Names::~Names(&targetNames);
LAB_0030fcc9:
    if ((long)filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)filesTo.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)filesTo.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("filesFrom.size() == filesTo.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x132,
                    "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    if (filesFrom.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        filesFrom.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      targetNames.Base._M_dataplus._M_p = (pointer)PreReplacementTweaks;
      targetNames.Base._M_string_length = 0;
      AddTweak(this,os,indent,config,&filesTo,in_R9);
      bVar1 = this->ImportLibrary;
      bVar2 = this->Optional;
      GetDestination(&targetNames.Base,this,config);
      uVar8 = (byte)(bVar2 | bVar1) & 1;
      tweak = (TweakMethod)uVar8;
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&targetNames.Base,type,&filesFrom,SUB41(uVar8,0)
                 ,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
                 literal_args._M_dataplus._M_p,indent);
      std::__cxx11::string::~string((string *)&targetNames);
      targetNames.Base._M_dataplus._M_p = (pointer)PostReplacementTweaks;
      targetNames.Base._M_string_length = 0;
      AddTweak(this,os,indent,config,&filesTo,tweak);
    }
  }
  else {
    cmGeneratorTarget::GetLibraryNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xac,
                      "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      psVar5 = &targetNames.ImportLibrary;
      std::operator+(&from1,&fromDirConfig,psVar5);
      std::operator+(&to1,&toDir,psVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                 &from1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,&to1)
      ;
      targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
      targetNameImportLib._M_string_length = 0;
      targetNameImportLib.field_2._M_local_buf[0] = '\0';
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,psVar5,&targetNameImportLib,(char *)0x0);
      if (bVar1) {
        std::operator+(&toSOName,&fromDirConfig,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::operator+(&toSOName,&toDir,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                   &toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
      }
      std::__cxx11::string::~string((string *)&targetNameImportLib);
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&from1);
      type = cmInstallType_STATIC_LIBRARY;
LAB_0030fcb2:
      bVar1 = true;
    }
    else {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar1) {
        bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar1) {
          std::__cxx11::string::append((char *)&literal_args);
          psVar5 = &targetNames.Output;
          std::__cxx11::string::find((char)psVar5,0x2f);
          std::__cxx11::string::substr((ulong)&from1,(ulong)psVar5);
          std::operator+(&to1,&fromDirConfig,&from1);
          std::operator+(&targetNameImportLib,&toDir,psVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom
                     ,&to1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                     &targetNameImportLib);
          std::__cxx11::string::~string((string *)&targetNameImportLib);
          goto LAB_0030f901;
        }
        psVar5 = &targetNames.Output;
        std::operator+(&from1,&fromDirConfig,psVar5);
        std::operator+(&to1,&toDir,psVar5);
        targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
        targetNameImportLib._M_string_length = 0;
        toSOName._M_dataplus._M_p = (pointer)&toSOName.field_2;
        toSOName._M_string_length = 0;
        targetNameImportLib.field_2._M_local_buf[0] = '\0';
        toSOName.field_2._M_local_buf[0] = '\0';
        bVar1 = std::operator!=(&targetNames.SharedObject,psVar5);
        if (bVar1) {
          std::operator+(&fromRealName,&fromDirConfig,&targetNames.SharedObject);
          std::__cxx11::string::operator=((string *)&targetNameImportLib,(string *)&fromRealName);
          std::__cxx11::string::~string((string *)&fromRealName);
          std::operator+(&fromRealName,&toDir,&targetNames.SharedObject);
          std::__cxx11::string::operator=((string *)&toSOName,(string *)&fromRealName);
          std::__cxx11::string::~string((string *)&fromRealName);
        }
        fromRealName._M_dataplus._M_p = (pointer)&fromRealName.field_2;
        fromRealName._M_string_length = 0;
        toRealName._M_dataplus._M_p = (pointer)&toRealName.field_2;
        toRealName._M_string_length = 0;
        fromRealName.field_2._M_local_buf[0] = '\0';
        toRealName.field_2._M_local_buf[0] = '\0';
        bVar2 = std::operator!=(&targetNames.Real,psVar5);
        if ((bVar2) && (bVar2 = std::operator!=(&targetNames.Real,&targetNames.SharedObject), bVar2)
           ) {
          std::operator+(&local_50,&fromDirConfig,&targetNames.Real);
          std::__cxx11::string::operator=((string *)&fromRealName,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::operator+(&local_50,&toDir,&targetNames.Real);
          std::__cxx11::string::operator=((string *)&toRealName,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
LAB_0030fbba:
          if (this->NamelinkMode == NamelinkModeOnly) goto LAB_0030fc49;
          if (fromRealName._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesFrom,&fromRealName);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesTo,&toRealName);
          }
          if (targetNameImportLib._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesFrom,&targetNameImportLib);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filesTo,&toSOName);
          }
          if (this->NamelinkMode != NamelinkModeSkip) goto LAB_0030fc49;
        }
        else {
          if (bVar1) goto LAB_0030fbba;
          if (this->NamelinkMode == NamelinkModeOnly) goto LAB_0030fc6d;
LAB_0030fc49:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&filesFrom,&from1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&filesTo,&to1);
        }
LAB_0030fc6d:
        std::__cxx11::string::~string((string *)&toRealName);
        std::__cxx11::string::~string((string *)&fromRealName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::__cxx11::string::~string((string *)&targetNameImportLib);
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::~string((string *)&from1);
        goto LAB_0030fcb2;
      }
      if (this->NamelinkMode == NamelinkModeOnly) {
        bVar1 = false;
      }
      else {
        if (this->NamelinkMode == NamelinkModeSkip) {
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+(&to1,"Target \'",psVar5);
          std::operator+(&from1,&to1,
                         "\' was changed to a FRAMEWORK sometime after install().  This may result in the wrong install DESTINATION.  Set the FRAMEWORK property earlier."
                        );
          std::__cxx11::string::~string((string *)&to1);
          pcVar6 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          cmake::IssueMessage(pcVar6->CMakeInstance,AUTHOR_WARNING,&from1,&this->Backtrace);
          std::__cxx11::string::~string((string *)&from1);
        }
        std::__cxx11::string::append((char *)&literal_args);
        std::operator+(&from1,&fromDirConfig,&targetNames.Output);
        cmsys::SystemTools::GetFilenamePath(&to1,&from1);
        std::__cxx11::string::operator=((string *)&from1,(string *)&to1);
        std::__cxx11::string::~string((string *)&to1);
        std::operator+(&to1,&toDir,&targetNames.Real);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesFrom,
                   &from1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesTo,
                   &to1);
LAB_0030f901:
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::~string((string *)&from1);
        bVar1 = true;
        type = cmInstallType_DIRECTORY;
      }
    }
    cmGeneratorTarget::Names::~Names(&targetNames);
    if (bVar1) goto LAB_0030fcc9;
  }
  std::__cxx11::string::~string((string *)&literal_args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filesTo);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filesFrom);
  std::__cxx11::string::~string((string *)&toDir);
  this_02 = (Names *)&fromDirConfig;
LAB_0030fe3d:
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  cmStateEnums::TargetType targetType = this->Target->GetType();
  cmInstallType type = cmInstallType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY:
      this->GenerateScriptForConfigObjectLibrary(os, config, indent);
      return;

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory();
    fromDirConfig += "/CMakeFiles";
    fromDirConfig += "/CMakeRelink.dir/";
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig = this->Target->GetDirectory(config, artifact);
    fromDirConfig += "/";
  }

  std::string toDir =
    this->ConvertToAbsoluteDestination(this->GetDestination(config));
  toDir += "/";

  // Compute the list of files to install for this target.
  std::vector<std::string> filesFrom;
  std::vector<std::string> filesTo;
  std::string literal_args;

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = toDir + targetNames.ImportLibrary;
      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = toDir + targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        const char* ext = this->Target->GetProperty("BUNDLE_EXTENSION");
        if (!ext) {
          ext = "app";
        }

        // Install the whole app bundle directory.
        type = cmInstallType_DIRECTORY;
        literal_args += " USE_SOURCE_PERMISSIONS";
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = toDir += targetNames.Real;
          filesFrom.push_back(std::move(from2));
          filesTo.push_back(std::move(to2));
        }
      }

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = toDir + targetNames.ImportLibrary;
      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
      }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = toDir + targetNames.Real;

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = toDir + targetNames.Output;

      filesFrom.push_back(std::move(from1));
      filesTo.push_back(std::move(to1));
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetNames.Output;
      std::string toName = toDir + targetNames.Output;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNames.SharedObject != targetNames.Output) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNames.SharedObject;
        toSOName = toDir + targetNames.SharedObject;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNames.Real != targetNames.Output &&
          targetNames.Real != targetNames.SharedObject) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNames.Real;
        toRealName = toDir + targetNames.Real;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            filesFrom.push_back(fromRealName);
            filesTo.push_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            filesFrom.push_back(fromSOName);
            filesTo.push_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            filesFrom.push_back(fromName);
            filesTo.push_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(filesFrom.size() == filesTo.size());

  // Skip this rule if no files are to be installed for the target.
  if (filesFrom.empty()) {
    return;
  }

  // Add pre-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PreReplacementTweaks);

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  this->AddInstallRule(os, this->GetDestination(config), type, filesFrom,
                       optional, this->FilePermissions.c_str(),
                       no_dir_permissions, no_rename, literal_args.c_str(),
                       indent);

  // Add post-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PostReplacementTweaks);
}